

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

int __thiscall
Gym_Emu::play_frame(Gym_Emu *this,blip_time_t blip_time,int sample_count,sample_t_conflict1 *buf)

{
  bool bVar1;
  void *in_RCX;
  int in_EDX;
  Sms_Apu *in_RDI;
  Gym_Emu *unaff_retaddr;
  int in_stack_ffffffffffffffdc;
  
  bVar1 = Music_Emu::track_ended((Music_Emu *)in_RDI);
  if (!bVar1) {
    parse_frame(unaff_retaddr);
  }
  Sms_Apu::end_frame(in_RDI,in_stack_ffffffffffffffdc);
  memset(in_RCX,0,(long)in_EDX << 1);
  Ym2612_Emu::run((Ym2612_Emu *)in_RDI,in_stack_ffffffffffffffdc,(sample_t_conflict1 *)0x95abe8);
  return in_EDX;
}

Assistant:

int Gym_Emu::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	if ( !track_ended() )
		parse_frame();
	
	apu.end_frame( blip_time );
	
	memset( buf, 0, sample_count * sizeof *buf );
	fm.run( sample_count >> 1, buf );
	
	return sample_count;
}